

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int read_char_literal(int pass,char delim)

{
  int iVar1;
  char *pcVar2;
  char in_SIL;
  int in_EDI;
  int c;
  uint local_10;
  uint local_4;
  
  pcVar2 = lineptr + 1;
  local_10 = (uint)*lineptr;
  ecolumn = column + 1;
  local_4 = local_10;
  if (local_10 == 0) {
    ecolumn = column;
    err(E,"unterminated character or string literal");
  }
  else if (local_10 == (int)in_SIL) {
    column = ecolumn;
    lineptr = pcVar2;
    if (in_SIL == '\'') {
      err(E,"empty character literal");
    }
  }
  else {
    iVar1 = ecolumn;
    if (local_10 == 0x5c) {
      lineptr = lineptr + 2;
      local_10 = (uint)*pcVar2;
      column = column + 2;
      iVar1 = column;
      pcVar2 = lineptr;
      ecolumn = column;
      switch(local_10) {
      case 0x22:
        local_10 = 0x22;
        break;
      default:
        if (in_EDI == 1) {
          err(W,"unknown escape sequence \'\\%c\'",(ulong)local_10);
          iVar1 = column;
          pcVar2 = lineptr;
        }
        break;
      case 0x27:
        local_10 = 0x27;
        break;
      case 0x3f:
        local_10 = 0x3f;
        break;
      case 0x5c:
        local_10 = 0x5c;
        break;
      case 0x61:
        local_10 = 7;
        break;
      case 0x62:
        local_10 = 8;
        break;
      case 0x65:
        local_10 = 0x1b;
        break;
      case 0x66:
        local_10 = 0xc;
        break;
      case 0x6e:
        local_10 = 10;
        break;
      case 0x72:
        local_10 = 0xd;
        break;
      case 0x74:
        local_10 = 9;
        break;
      case 0x76:
        local_10 = 0xb;
      }
    }
    lineptr = pcVar2;
    column = iVar1;
    local_4 = local_10;
  }
  return local_4;
}

Assistant:

int read_char_literal(int pass, char delim)
{
    int c = *lineptr++;
    ecolumn = ++column;
    if (!c)
    {
        --lineptr;
        ecolumn = --column;
        err(E, "unterminated character or string literal");
        return c;
    }
    if (c == delim)
    {
        if (delim == '\'')
            err(E, "empty character literal");
        return c;
    }

    if (c == '\\')
    {
        c = *lineptr++;
        ecolumn = ++column;
        switch (c)
        {
            case 'a': c = '\a'; break;
            case 'b': c = '\b'; break;
            case 'e': c = '\e'; break;
            case 'f': c = '\f'; break;
            case 'n': c = '\n'; break;
            case 'r': c = '\r'; break;
            case 't': c = '\t'; break;
            case 'v': c = '\v'; break;
            case '\\': c = '\\'; break;
            case '\'': c = '\''; break;
            case '\"': c = '\"'; break;
            case '\?': c = '\?'; break;
            default:
                if (pass == READ_PASS)
                    err(W, "unknown escape sequence \'\\%c\'", c);
        }
    }
    return c;
}